

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.hpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMAttrNSImpl::~DOMAttrNSImpl(DOMAttrNSImpl *this)

{
  ~DOMAttrNSImpl((DOMAttrNSImpl *)&this[-1].fLocalName);
  return;
}

Assistant:

class CDOM_EXPORT DOMAttrNSImpl: public DOMAttrImpl {
protected:
    //Introduced in DOM Level 2
    const XMLCh * fNamespaceURI;     //namespace URI of this node
    const XMLCh * fLocalName;        //local part of qualified name
    const XMLCh * fPrefix;           // prefix part of qualified name
                           // revisit - can return local part
                           //    by pointing into the qualified (L1) name.

public:
    DOMAttrNSImpl(DOMDocument *ownerDoc, const XMLCh *name);
    DOMAttrNSImpl(DOMDocument *ownerDoc, //DOM Level 2
                  const XMLCh *namespaceURI, const XMLCh *qualifiedName);
    DOMAttrNSImpl(const DOMAttrNSImpl &other, bool deep=false);

    // Fast construction without any checks for name validity. Used in
    // parsing. Note that if prefix is not specified and localName is
    // 'xmlns', this constructor expects proper namespaceURI.
    //
    DOMAttrNSImpl(DOMDocument *ownerDoc,
                  const XMLCh *namespaceURI,
                  const XMLCh *prefix,        // Null or empty - no prefix.
                  const XMLCh *localName,
                  const XMLCh *qualifiedName);

    virtual DOMNode * cloneNode(bool deep) const;
    //Introduced in DOM Level 2
    virtual const XMLCh *   getNamespaceURI() const;
    virtual const XMLCh *   getPrefix() const;
    virtual const XMLCh *   getLocalName() const;
    virtual void            setPrefix(const XMLCh *prefix);
    virtual void            release();

   // helper function for DOM Level 3 renameNode
   virtual DOMNode* rename(const XMLCh* namespaceURI, const XMLCh* name);
   void setName(const XMLCh* namespaceURI, const XMLCh* name);

private:
    // -----------------------------------------------------------------------
    // Unimplemented constructors and operators
    // -----------------------------------------------------------------------
    DOMAttrNSImpl & operator = (const DOMAttrNSImpl &);
}